

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O3

ssh_key * dsa_new_priv_openssh(ssh_keyalg *self,BinarySource *src)

{
  uint uVar1;
  undefined8 *puVar2;
  mp_int *pmVar3;
  
  puVar2 = (undefined8 *)safemalloc(1,0x30,0);
  puVar2[5] = &ssh_dsa;
  pmVar3 = BinarySource_get_mp_ssh2(src->binarysource_);
  *puVar2 = pmVar3;
  pmVar3 = BinarySource_get_mp_ssh2(src->binarysource_);
  puVar2[1] = pmVar3;
  pmVar3 = BinarySource_get_mp_ssh2(src->binarysource_);
  puVar2[2] = pmVar3;
  pmVar3 = BinarySource_get_mp_ssh2(src->binarysource_);
  puVar2[3] = pmVar3;
  pmVar3 = BinarySource_get_mp_ssh2(src->binarysource_);
  puVar2[4] = pmVar3;
  if (((src->binarysource_->err == BSE_NO_ERROR) &&
      (uVar1 = mp_eq_integer((mp_int *)puVar2[1],0), uVar1 == 0)) &&
     (uVar1 = mp_eq_integer((mp_int *)*puVar2,0), uVar1 == 0)) {
    return (ssh_key *)(puVar2 + 5);
  }
  dsa_freekey((ssh_key *)(puVar2 + 5));
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *dsa_new_priv_openssh(const ssh_keyalg *self,
                                     BinarySource *src)
{
    struct dsa_key *dsa;

    dsa = snew(struct dsa_key);
    dsa->sshk.vt = &ssh_dsa;

    dsa->p = get_mp_ssh2(src);
    dsa->q = get_mp_ssh2(src);
    dsa->g = get_mp_ssh2(src);
    dsa->y = get_mp_ssh2(src);
    dsa->x = get_mp_ssh2(src);

    if (get_err(src) ||
        mp_eq_integer(dsa->q, 0) || mp_eq_integer(dsa->p, 0)) {
        /* Invalid key. */
        dsa_freekey(&dsa->sshk);
        return NULL;
    }

    return &dsa->sshk;
}